

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

opj_image_t * pgxtoimage(char *filename,opj_cparameters_t *parameters)

{
  byte bVar1;
  uchar uVar2;
  unsigned_short uVar3;
  int iVar4;
  uint uVar5;
  long __off;
  size_t sVar6;
  OPJ_UINT32 local_124;
  OPJ_UINT32 local_120;
  int local_11c;
  uint local_10c;
  int v;
  long curpos;
  long lStack_f8;
  char ch;
  opj_image_comp_t *comp;
  undefined1 local_e8 [4];
  int bigendian;
  char temp [32];
  char signtmp [32];
  char local_9b;
  char local_9a;
  char local_99;
  char sign;
  char endian2;
  ulong uStack_98;
  char endian1;
  OPJ_UINT64 expected_file_size;
  int force8;
  int dshift;
  int ushift;
  int adjustS;
  opj_image_t *image;
  opj_image_cmptparm_t cmptparm;
  OPJ_COLOR_SPACE color_space;
  int max;
  int numcomps;
  int i;
  int prec;
  int h;
  int w;
  FILE *f;
  opj_cparameters_t *parameters_local;
  char *filename_local;
  
  _h = (FILE *)0x0;
  _ushift = (OPJ_UINT32 *)0x0;
  lStack_f8 = 0;
  cmptparm.bpp = 2;
  f = (FILE *)parameters;
  parameters_local = (opj_cparameters_t *)filename;
  memset(&image,0,0x24);
  cmptparm.sgnd = 0;
  _h = fopen((char *)parameters_local,"rb");
  if (_h == (FILE *)0x0) {
    fprintf(_stderr,"Failed to open %s for reading !\n",parameters_local);
    filename_local = (char *)0x0;
  }
  else {
    fseek(_h,0,0);
    iVar4 = __isoc99_fscanf(_h,"PG%31[ \t]%c%c%31[ \t+-]%d%31[ \t]%d%31[ \t]%d",local_e8,&local_99,
                            &local_9a,temp + 0x18,&numcomps,local_e8,&prec,local_e8,&i);
    if (iVar4 == 9) {
      max = 0;
      local_9b = '+';
      while (temp[(long)max + 0x18] != '\0') {
        if (temp[(long)max + 0x18] == '-') {
          local_9b = '-';
        }
        max = max + 1;
      }
      fgetc(_h);
      if ((local_99 == 'M') && (local_9a == 'L')) {
        comp._4_4_ = 1;
      }
      else {
        if ((local_9a != 'M') || (local_99 != 'L')) {
          fclose(_h);
          fprintf(_stderr,"Bad pgx header, please check input file\n");
          return (opj_image_t *)0x0;
        }
        comp._4_4_ = 0;
      }
      if ((((prec < 1) || (i < 1)) || (numcomps < 1)) || (0x1f < numcomps)) {
        fclose(_h);
        fprintf(_stderr,"Bad pgx header, please check input file\n");
        filename_local = (char *)0x0;
      }
      else {
        if (numcomps < 0x11) {
          local_11c = 1;
          if (8 < numcomps) {
            local_11c = 2;
          }
        }
        else {
          local_11c = 4;
        }
        uStack_98 = (long)prec * (long)i * (long)local_11c;
        if (10000000 < uStack_98) {
          __off = ftell(_h);
          if (0x7fffffff < uStack_98) {
            uStack_98 = 0x7fffffff;
          }
          fseek(_h,uStack_98 - 1,0);
          sVar6 = fread((void *)((long)&curpos + 7),1,1,_h);
          if (sVar6 != 1) {
            fprintf(_stderr,"File too short\n");
            fclose(_h);
            return (opj_image_t *)0x0;
          }
          fseek(_h,__off,0);
        }
        cmptparm.w = *(OPJ_UINT32 *)((long)&f[0x54]._IO_write_ptr + 4);
        cmptparm.h = *(OPJ_UINT32 *)&f[0x54]._IO_write_end;
        if (cmptparm.w == 0) {
          iVar4 = (prec + -1) * *(int *)((long)&f[0x54]._IO_write_end + 4);
        }
        else {
          iVar4 = cmptparm.w + (prec + -1) * *(int *)((long)&f[0x54]._IO_write_end + 4);
        }
        local_120 = iVar4 + 1;
        cmptparm.dx = local_120;
        if (cmptparm.h == 0) {
          iVar4 = (i + -1) * *(int *)&f[0x54]._IO_buf_base;
        }
        else {
          iVar4 = cmptparm.h + (i + -1) * *(int *)&f[0x54]._IO_buf_base;
        }
        local_124 = iVar4 + 1;
        cmptparm.dy = local_124;
        cmptparm.prec = (OPJ_UINT32)(local_9b == '-');
        if (numcomps < 8) {
          expected_file_size._0_4_ = 1;
          force8 = 8 - numcomps;
          expected_file_size._4_4_ = numcomps - force8;
          if (cmptparm.prec == 0) {
            dshift = 0;
          }
          else {
            dshift = 1 << ((char)numcomps - 1U & 0x1f);
          }
          cmptparm.prec = 0;
          numcomps = 8;
        }
        else {
          dshift = 0;
          expected_file_size._0_4_ = 0;
          expected_file_size._4_4_ = 0;
          force8 = 0;
        }
        cmptparm.x0 = numcomps;
        image._0_4_ = *(undefined4 *)((long)&f[0x54]._IO_write_end + 4);
        image._4_4_ = *(undefined4 *)&f[0x54]._IO_buf_base;
        _ushift = (OPJ_UINT32 *)opj_image_create(1,&image,cmptparm.bpp);
        if (_ushift == (OPJ_UINT32 *)0x0) {
          fclose(_h);
          filename_local = (char *)0x0;
        }
        else {
          *_ushift = cmptparm.w;
          _ushift[1] = cmptparm.w;
          _ushift[2] = cmptparm.dx;
          _ushift[3] = cmptparm.dy;
          lStack_f8 = *(long *)(_ushift + 6);
          for (max = 0; max < prec * i; max = max + 1) {
            if ((int)expected_file_size == 0) {
              if (*(int *)(lStack_f8 + 0x18) == 8) {
                if (*(int *)(lStack_f8 + 0x20) == 0) {
                  bVar1 = readuchar((FILE *)_h);
                  local_10c = (uint)bVar1;
                }
                else {
                  uVar2 = readuchar((FILE *)_h);
                  local_10c = (uint)(char)uVar2;
                }
              }
              else if (*(uint *)(lStack_f8 + 0x18) < 0x11) {
                if (*(int *)(lStack_f8 + 0x20) == 0) {
                  uVar3 = readushort((FILE *)_h,comp._4_4_);
                  local_10c = (uint)uVar3;
                }
                else {
                  uVar3 = readushort((FILE *)_h,comp._4_4_);
                  local_10c = (uint)(short)uVar3;
                }
              }
              else if (*(int *)(lStack_f8 + 0x20) == 0) {
                local_10c = readuint((FILE *)_h,comp._4_4_);
              }
              else {
                local_10c = readuint((FILE *)_h,comp._4_4_);
              }
              if ((int)cmptparm.sgnd < (int)local_10c) {
                cmptparm.sgnd = local_10c;
              }
              *(uint *)(*(long *)(lStack_f8 + 0x30) + (long)max * 4) = local_10c;
            }
            else {
              bVar1 = readuchar((FILE *)_h);
              uVar5 = ((uint)bVar1 + dshift << ((byte)force8 & 0x1f)) +
                      ((int)((uint)bVar1 + dshift) >> ((byte)expected_file_size._4_4_ & 0x1f));
              *(uint *)(*(long *)(lStack_f8 + 0x30) + (long)max * 4) = uVar5 & 0xff;
              if ((int)cmptparm.sgnd < (int)uVar5) {
                cmptparm.sgnd = uVar5;
              }
            }
          }
          fclose(_h);
          iVar4 = int_floorlog2(cmptparm.sgnd);
          *(int *)(lStack_f8 + 0x18) = iVar4 + 1;
          filename_local = (char *)_ushift;
        }
      }
    }
    else {
      fclose(_h);
      fprintf(_stderr,
              "ERROR: Failed to read the right number of element from the fscanf() function!\n");
      filename_local = (char *)0x0;
    }
  }
  return (opj_image_t *)filename_local;
}

Assistant:

opj_image_t* pgxtoimage(const char *filename, opj_cparameters_t *parameters)
{
    FILE *f = NULL;
    int w, h, prec;
    int i, numcomps, max;
    OPJ_COLOR_SPACE color_space;
    opj_image_cmptparm_t cmptparm;  /* maximum of 1 component  */
    opj_image_t * image = NULL;
    int adjustS, ushift, dshift, force8;
    OPJ_UINT64 expected_file_size;

    char endian1, endian2, sign;
    char signtmp[32];

    char temp[32];
    int bigendian;
    opj_image_comp_t *comp = NULL;

    numcomps = 1;
    color_space = OPJ_CLRSPC_GRAY;

    memset(&cmptparm, 0, sizeof(opj_image_cmptparm_t));

    max = 0;

    f = fopen(filename, "rb");
    if (!f) {
        fprintf(stderr, "Failed to open %s for reading !\n", filename);
        return NULL;
    }

    fseek(f, 0, SEEK_SET);
    if (fscanf(f, "PG%31[ \t]%c%c%31[ \t+-]%d%31[ \t]%d%31[ \t]%d", temp, &endian1,
               &endian2, signtmp, &prec, temp, &w, temp, &h) != 9) {
        fclose(f);
        fprintf(stderr,
                "ERROR: Failed to read the right number of element from the fscanf() function!\n");
        return NULL;
    }

    i = 0;
    sign = '+';
    while (signtmp[i] != '\0') {
        if (signtmp[i] == '-') {
            sign = '-';
        }
        i++;
    }

    fgetc(f);
    if (endian1 == 'M' && endian2 == 'L') {
        bigendian = 1;
    } else if (endian2 == 'M' && endian1 == 'L') {
        bigendian = 0;
    } else {
        fclose(f);
        fprintf(stderr, "Bad pgx header, please check input file\n");
        return NULL;
    }

    if (w < 1 || h < 1 || prec < 1 || prec > 31) {
        fclose(f);
        fprintf(stderr, "Bad pgx header, please check input file\n");
        return NULL;
    }

    expected_file_size =
        (OPJ_UINT64)w * (OPJ_UINT64)h * (prec > 16 ? 4 : prec > 8 ? 2 : 1);
    if (expected_file_size > 10000000U) {
        char ch;
        long curpos = ftell(f);
        if (expected_file_size > (OPJ_UINT64)INT_MAX) {
            expected_file_size = (OPJ_UINT64)INT_MAX;
        }
        fseek(f, (long)expected_file_size - 1, SEEK_SET);
        if (fread(&ch, 1, 1, f) != 1) {
            fprintf(stderr, "File too short\n");
            fclose(f);
            return NULL;
        }
        fseek(f, curpos, SEEK_SET);
    }

    /* initialize image component */

    cmptparm.x0 = (OPJ_UINT32)parameters->image_offset_x0;
    cmptparm.y0 = (OPJ_UINT32)parameters->image_offset_y0;
    cmptparm.w = !cmptparm.x0 ? (OPJ_UINT32)((w - 1) * parameters->subsampling_dx +
                 1) : cmptparm.x0 + (OPJ_UINT32)(w - 1) * (OPJ_UINT32)parameters->subsampling_dx
                 + 1;
    cmptparm.h = !cmptparm.y0 ? (OPJ_UINT32)((h - 1) * parameters->subsampling_dy +
                 1) : cmptparm.y0 + (OPJ_UINT32)(h - 1) * (OPJ_UINT32)parameters->subsampling_dy
                 + 1;

    if (sign == '-') {
        cmptparm.sgnd = 1;
    } else {
        cmptparm.sgnd = 0;
    }
    if (prec < 8) {
        force8 = 1;
        ushift = 8 - prec;
        dshift = prec - ushift;
        if (cmptparm.sgnd) {
            adjustS = (1 << (prec - 1));
        } else {
            adjustS = 0;
        }
        cmptparm.sgnd = 0;
        prec = 8;
    } else {
        ushift = dshift = force8 = adjustS = 0;
    }

    cmptparm.prec = (OPJ_UINT32)prec;
    cmptparm.dx = (OPJ_UINT32)parameters->subsampling_dx;
    cmptparm.dy = (OPJ_UINT32)parameters->subsampling_dy;

    /* create the image */
    image = opj_image_create((OPJ_UINT32)numcomps, &cmptparm, color_space);
    if (!image) {
        fclose(f);
        return NULL;
    }
    /* set image offset and reference grid */
    image->x0 = cmptparm.x0;
    image->y0 = cmptparm.x0;
    image->x1 = cmptparm.w;
    image->y1 = cmptparm.h;

    /* set image data */

    comp = &image->comps[0];

    for (i = 0; i < w * h; i++) {
        int v;
        if (force8) {
            v = readuchar(f) + adjustS;
            v = (v << ushift) + (v >> dshift);
            comp->data[i] = (unsigned char)v;

            if (v > max) {
                max = v;
            }

            continue;
        }
        if (comp->prec == 8) {
            if (!comp->sgnd) {
                v = readuchar(f);
            } else {
                v = (char) readuchar(f);
            }
        } else if (comp->prec <= 16) {
            if (!comp->sgnd) {
                v = readushort(f, bigendian);
            } else {
                v = (short) readushort(f, bigendian);
            }
        } else {
            if (!comp->sgnd) {
                v = (int)readuint(f, bigendian);
            } else {
                v = (int) readuint(f, bigendian);
            }
        }
        if (v > max) {
            max = v;
        }
        comp->data[i] = v;
    }
    fclose(f);
    comp->prec = (OPJ_UINT32)int_floorlog2(max) + 1;

    return image;
}